

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CumulativeReporterBase::SectionNode::~SectionNode(SectionNode *this)

{
  undefined8 *in_RDI;
  vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SectionNode_002378b8;
  std::__cxx11::string::~string((string *)(in_RDI + 0x1f));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1b));
  std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::~vector(unaff_retaddr)
  ;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::~vector((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
             *)unaff_retaddr);
  SectionStats::~SectionStats((SectionStats *)0x1a08ce);
  SharedImpl<Catch::IShared>::~SharedImpl((SharedImpl<Catch::IShared> *)0x1a08d8);
  return;
}

Assistant:

CumulativeReporterBase::SectionNode::~SectionNode() {}